

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_preprocessAndSolveReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool applySimplifier,bool *interrupt)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  double dVar1;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  Settings *pSVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  Result simplificationStatus;
  double *pdVar4;
  long lVar5;
  byte bVar6;
  undefined7 in_register_00000031;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_02;
  bool bVar9;
  byte bVar10;
  double extraout_XMM0_Qa;
  Real local_240;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar10 = 0;
  this_02 = &(this->_solver).
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .offset;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)this_02,this->_currentSettings->_realParamValues[0x17])
  ;
  (*this->_statistics->preprocessingTime->_vptr_Timer[3])();
  this->_applyPolishing = false;
  if ((int)CONCAT71(in_register_00000031,applySimplifier) == 0) {
    this->_simplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    if (this->_isRealLPScaled == false) {
      this->_scaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
    }
LAB_004612b1:
    if (this->_scaler ==
        (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      bVar6 = 0;
    }
    else {
      bVar6 = this->_isRealLPScaled ^ 1;
    }
  }
  else {
    _enableSimplifierAndScaler(this);
    bVar6 = 1;
    if (this->_simplifier ==
        (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) goto LAB_004612b1;
  }
  if ((this->_solver).useTerminationValue == true) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_b0,
               this->_currentSettings->_realParamValues
               [(ulong)(this->_currentSettings->_intParamValues[0] == -1) + 8],(type *)0x0);
    pcVar7 = &local_b0;
    pnVar8 = &(this->_solver).objLimit;
    for (lVar5 = 0x1c; local_130._120_8_ = local_b0._120_8_, local_130.exp = local_b0.exp,
        local_130.neg = local_b0.neg, lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + (ulong)bVar10 * -8 + 4);
    }
  }
  else {
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_130,*pdVar4,(type *)0x0);
    pcVar7 = &local_130;
    pnVar8 = &(this->_solver).objLimit;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + (ulong)bVar10 * -8 + 4);
    }
    (this->_solver).useTerminationValue = true;
  }
  this_00 = &this->_solver;
  (this->_solver).objLimit.m_backend.exp = local_130.exp;
  (this->_solver).objLimit.m_backend.neg = local_130.neg;
  (this->_solver).objLimit.m_backend.fpclass = local_130.fpclass;
  (this->_solver).objLimit.m_backend.prec_elem = local_130.prec_elem;
  if (this->_isRealLPLoaded == true) {
    if (bVar6 == 0) goto LAB_0046142c;
    this->_realLP =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&this->_realLP,1);
    this_01 = this->_realLP;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SPxLPBase(this_01,&this_00->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    this->_realLP = this_01;
    bVar9 = false;
  }
  else {
    if (this->_hasBasis == true) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(this_00,this->_realLP,false);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasis(this_00,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    }
    else {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(this_00,this->_realLP,true);
    }
    if (bVar6 != 0) goto LAB_0046142c;
    (**(this->_realLP->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .
       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._vptr_ClassArray)();
    spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&this->_realLP);
    this->_realLP =
         &this_00->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    bVar9 = true;
  }
  this->_isRealLPLoaded = bVar9;
LAB_0046142c:
  if (this->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    simplificationStatus = OKAY;
  }
  else {
    pSVar2 = this->_currentSettings;
    bVar9 = pSVar2->_intParamValues[0xe] == 3;
    if ((pSVar2->_intParamValues[1] == 2) ||
       ((pSVar2->_intParamValues[1] == 0 &&
        ((double)((this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum + 1) * pSVar2->_realParamValues[0x10] <
         (double)((this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum + 1))))) {
      bVar9 = (bool)(pSVar2->_intParamValues[0xe] == 3 & pSVar2->_boolParamValues[8]);
    }
    dVar1 = (this->_solver).maxTime;
    (*((this->_solver).theTime)->_vptr_Timer[6])();
    simplificationStatus =
         (*this->_simplifier->_vptr_SPxSimplifier[5])
                   (dVar1 - extraout_XMM0_Qa,this->_simplifier,this_00,(ulong)bVar9,
                    (ulong)(this->_solver).random.seedshift);
    (*this->_simplifier->_vptr_SPxSimplifier[0x10])(&local_1b0);
    local_240 = this->_currentSettings->_realParamValues[0x17];
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 0x1c;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems[6] = 0;
    local_238.data._M_elems[7] = 0;
    local_238.data._M_elems[8] = 0;
    local_238.data._M_elems[9] = 0;
    local_238.data._M_elems[10] = 0;
    local_238.data._M_elems[0xb] = 0;
    local_238.data._M_elems[0xc] = 0;
    local_238.data._M_elems[0xd] = 0;
    local_238.data._M_elems[0xe] = 0;
    local_238.data._M_elems[0xf] = 0;
    local_238.data._M_elems[0x10] = 0;
    local_238.data._M_elems[0x11] = 0;
    local_238.data._M_elems[0x12] = 0;
    local_238.data._M_elems[0x13] = 0;
    local_238.data._M_elems[0x14] = 0;
    local_238.data._M_elems[0x15] = 0;
    local_238.data._M_elems[0x16] = 0;
    local_238.data._M_elems[0x17] = 0;
    local_238.data._M_elems[0x18] = 0;
    local_238.data._M_elems[0x19] = 0;
    local_238.data._M_elems._104_5_ = 0;
    local_238.data._M_elems[0x1b]._1_3_ = 0;
    local_238.exp = 0;
    local_238.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&local_238,&local_1b0,&local_240);
    pcVar7 = &local_238;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (this_02->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
      this_02 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)this_02 + (ulong)bVar10 * -8 + 4);
    }
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.exp = local_238.exp;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.neg = local_238.neg;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.fpclass = local_238.fpclass;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.prec_elem = local_238.prec_elem;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ._isScaled = false;
    this->_applyPolishing = true;
    (this->_solver).polishObj = POLISH_OFF;
  }
  (*this->_statistics->preprocessingTime->_vptr_Timer[4])();
  if (simplificationStatus == OKAY) {
    pSVar3 = this->_scaler;
    if ((pSVar3 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       ((this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ._isScaled == false)) {
      (*pSVar3->_vptr_SPxScaler[0xd])(pSVar3,this_00,0);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::invalidateBasis(this_00);
    }
    _solveRealLPAndRecordStatistics(this,interrupt);
  }
  _evaluateSolutionReal(this,simplificationStatus);
  return;
}

Assistant:

void SoPlexBase<R>::_preprocessAndSolveReal(bool applySimplifier, volatile bool* interrupt)
{
   _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
   _statistics->preprocessingTime->start();

   _applyPolishing = false;

   if(applySimplifier)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

   // create a copy of the LP when simplifying or when using internal scaling, i.e. w/o persistent scaling
   bool copyLP = (_simplifier != nullptr || (_scaler && !_isRealLPScaled));

   // set the objective limit if it was not explicitly disabled for this particular solving call
   if(_solver.isTerminationValueEnabled())
   {
      _solver.setTerminationValue(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                                  ? realParam(SoPlexBase<R>::OBJLIMIT_UPPER) : realParam(SoPlexBase<R>::OBJLIMIT_LOWER));
   }
   // reset the objective limit and reenabled it for the next solve
   else
   {
      _solver.setTerminationValue();
      _solver.toggleTerminationValue(true);
   }

   if(_isRealLPLoaded)
   {
      assert(_realLP == &_solver);

      // preprocessing is always applied to the LP in the solver; hence we have to create a copy of the original LP
      // if simplifier is turned on
      if(copyLP)
      {
         _realLP = nullptr;
         spx_alloc(_realLP);
         _realLP = new(_realLP) SPxLPBase<R>(_solver);
         _isRealLPLoaded = false;
      }
   }
   else
   {
      assert(_realLP != &_solver);

      // load real LP and basis if available
      if(_hasBasis)
      {
         assert(_basisStatusRows.size() == numRows());
         assert(_basisStatusCols.size() == this->numCols());

         _solver.loadLP(*_realLP, false);
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      }
      // load real LP and set up slack basis
      else
         _solver.loadLP(*_realLP, true);

      // if there is no simplifier, then the original and the transformed problem are identical and it is more
      // memory-efficient to keep only the problem in the solver
      if(!copyLP)
      {
         _realLP->~SPxLPBase<R>();
         spx_free(_realLP);
         _realLP = &_solver;
         _isRealLPLoaded = true;
      }
   }

   // assert that we have two problems if and only if we apply the simplifier
   assert(_realLP == &_solver || copyLP);
   assert(_realLP != &_solver || !copyLP);

   // apply problem simplification
   typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

   if(_simplifier)
   {
      assert(!_isRealLPLoaded);
      // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used; also respect row-boundflip parameter
      bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

      if(intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
         keepbounds &= boolParam(SoPlexBase<R>::ROWBOUNDFLIPS);

      Real remainingTime = _solver.getMaxTime() - _solver.time();
      simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                             _solver.random.getSeed());
      _solver.changeObjOffset(_simplifier->getObjoffset() + realParam(SoPlexBase<R>::OBJ_OFFSET));
      _solver.setScalingInfo(false);
      _applyPolishing = true;

      _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
   }

   _statistics->preprocessingTime->stop();

   // run the simplex method if problem has not been solved by the simplifier
   if(simplificationStatus == SPxSimplifier<R>::OKAY)
   {
      if(_scaler && !_solver.isScaled())
      {
         _scaler->scale(_solver, false);
         _solver.invalidateBasis();
      }

      _solveRealLPAndRecordStatistics(interrupt);
   }

   _evaluateSolutionReal(simplificationStatus);
}